

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

void __thiscall
libcellml::Parser::ParserImpl::loadUnits(ParserImpl *this,UnitsPtr *units,XmlNodePtr *node)

{
  element_type *peVar1;
  IssueImpl *pIVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  bool bVar4;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  undefined8 uVar5;
  long *plVar6;
  undefined8 *puVar7;
  long *plVar8;
  ulong *puVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  size_type *psVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  ulong uVar13;
  IssuePtr issue_1;
  string textNode;
  XmlNodePtr childNode;
  IssuePtr issue_2;
  XmlAttributePtr attribute;
  string local_138;
  ulong *local_118;
  long local_110;
  ulong local_108;
  long lStack_100;
  string local_f8;
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  string local_b0;
  IssuePtr local_90;
  string local_80;
  IssuePtr local_60;
  XmlAttributePtr local_50;
  ulong local_40;
  XmlNodePtr *local_38;
  
  XmlNode::firstAttribute((XmlNode *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    paVar12 = &local_f8.field_2;
    local_40 = 0;
    local_38 = node;
    do {
      bVar4 = XmlAttribute::isType
                        (local_50.
                         super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr,"name","");
      if (bVar4) {
        peVar1 = (units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        XmlAttribute::value_abi_cxx11_
                  (&local_f8,
                   local_50.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr);
        NamedEntity::setName(&peVar1->super_NamedEntity,&local_f8);
        uVar5 = extraout_RAX;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != paVar12) {
          operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
          uVar5 = extraout_RAX_00;
        }
        local_40 = CONCAT71((int7)((ulong)uVar5 >> 8),1);
      }
      else {
        bVar4 = isIdAttribute(&local_50,this->mParsing1XVersion);
        if (bVar4) {
          peVar1 = (units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          XmlAttribute::value_abi_cxx11_
                    (&local_f8,
                     local_50.
                     super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
          ;
          Entity::setId((Entity *)peVar1,&local_f8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != paVar12) {
            operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          Issue::IssueImpl::create();
          pIVar2 = *(IssueImpl **)
                    ((long)local_90.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr + 8);
          if (this->mParsing1XVersion == true) {
            NamedEntity::name_abi_cxx11_
                      (&local_80,
                       &((units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>).
                        _M_ptr)->super_NamedEntity);
            plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_80,0,(char *)0x0,0x2a2452);
            local_d0 = &local_c0;
            plVar8 = plVar6 + 2;
            if ((long *)*plVar6 == plVar8) {
              local_c0 = *plVar8;
              lStack_b8 = plVar6[3];
            }
            else {
              local_c0 = *plVar8;
              local_d0 = (long *)*plVar6;
            }
            local_c8 = plVar6[1];
            *plVar6 = (long)plVar8;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            plVar6 = (long *)std::__cxx11::string::append((char *)&local_d0);
            local_118 = &local_108;
            puVar9 = (ulong *)(plVar6 + 2);
            if ((ulong *)*plVar6 == puVar9) {
              local_108 = *puVar9;
              lStack_100 = plVar6[3];
            }
            else {
              local_108 = *puVar9;
              local_118 = (ulong *)*plVar6;
            }
            local_110 = plVar6[1];
            *plVar6 = (long)puVar9;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            XmlAttribute::name_abi_cxx11_
                      (&local_b0,
                       local_50.
                       super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
            uVar13 = 0xf;
            if (local_118 != &local_108) {
              uVar13 = local_108;
            }
            if (uVar13 < local_b0._M_string_length + local_110) {
              uVar5 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
                uVar5 = local_b0.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar5 < local_b0._M_string_length + local_110) goto LAB_0023d4f9;
              puVar7 = (undefined8 *)
                       std::__cxx11::string::replace
                                 ((ulong)&local_b0,0,(char *)0x0,(ulong)local_118);
            }
            else {
LAB_0023d4f9:
              puVar7 = (undefined8 *)
                       std::__cxx11::string::_M_append
                                 ((char *)&local_118,(ulong)local_b0._M_dataplus._M_p);
            }
            local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
            psVar11 = puVar7 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar7 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar11) {
              local_138.field_2._M_allocated_capacity = *psVar11;
              local_138.field_2._8_8_ = puVar7[3];
            }
            else {
              local_138.field_2._M_allocated_capacity = *psVar11;
              local_138._M_dataplus._M_p = (pointer)*puVar7;
            }
            local_138._M_string_length = puVar7[1];
            *puVar7 = psVar11;
            puVar7[1] = 0;
            *(undefined1 *)psVar11 = 0;
            plVar6 = (long *)std::__cxx11::string::append((char *)&local_138);
            paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(plVar6 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar6 == paVar10) {
              local_f8.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
              local_f8.field_2._8_8_ = plVar6[3];
              local_f8._M_dataplus._M_p = (pointer)paVar12;
            }
            else {
              local_f8.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
              local_f8._M_dataplus._M_p = (pointer)*plVar6;
            }
            local_f8._M_string_length = plVar6[1];
            *plVar6 = (long)paVar10;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            Issue::IssueImpl::setDescription(pIVar2,&local_f8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f8._M_dataplus._M_p != paVar12) {
              operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_138._M_dataplus._M_p != &local_138.field_2) {
              operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
              operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
            }
            if (local_118 != &local_108) {
              operator_delete(local_118,local_108 + 1);
            }
            if (local_d0 != &local_c0) {
              operator_delete(local_d0,local_c0 + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_80._M_dataplus._M_p != &local_80.field_2) {
              operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
            }
            Issue::IssueImpl::setLevel
                      (*(IssueImpl **)
                        ((long)local_90.
                               super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr + 8),MESSAGE);
          }
          else {
            NamedEntity::name_abi_cxx11_
                      (&local_80,
                       &((units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>).
                        _M_ptr)->super_NamedEntity);
            plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_80,0,(char *)0x0,0x2a2452);
            local_d0 = &local_c0;
            plVar8 = plVar6 + 2;
            if ((long *)*plVar6 == plVar8) {
              local_c0 = *plVar8;
              lStack_b8 = plVar6[3];
            }
            else {
              local_c0 = *plVar8;
              local_d0 = (long *)*plVar6;
            }
            local_c8 = plVar6[1];
            *plVar6 = (long)plVar8;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            plVar6 = (long *)std::__cxx11::string::append((char *)&local_d0);
            local_118 = &local_108;
            puVar9 = (ulong *)(plVar6 + 2);
            if ((ulong *)*plVar6 == puVar9) {
              local_108 = *puVar9;
              lStack_100 = plVar6[3];
            }
            else {
              local_108 = *puVar9;
              local_118 = (ulong *)*plVar6;
            }
            local_110 = plVar6[1];
            *plVar6 = (long)puVar9;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            XmlAttribute::name_abi_cxx11_
                      (&local_b0,
                       local_50.
                       super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
            uVar13 = 0xf;
            if (local_118 != &local_108) {
              uVar13 = local_108;
            }
            if (uVar13 < local_b0._M_string_length + local_110) {
              uVar5 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
                uVar5 = local_b0.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar5 < local_b0._M_string_length + local_110) goto LAB_0023d59a;
              puVar7 = (undefined8 *)
                       std::__cxx11::string::replace
                                 ((ulong)&local_b0,0,(char *)0x0,(ulong)local_118);
            }
            else {
LAB_0023d59a:
              puVar7 = (undefined8 *)
                       std::__cxx11::string::_M_append
                                 ((char *)&local_118,(ulong)local_b0._M_dataplus._M_p);
            }
            local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
            psVar11 = puVar7 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar7 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar11) {
              local_138.field_2._M_allocated_capacity = *psVar11;
              local_138.field_2._8_8_ = puVar7[3];
            }
            else {
              local_138.field_2._M_allocated_capacity = *psVar11;
              local_138._M_dataplus._M_p = (pointer)*puVar7;
            }
            local_138._M_string_length = puVar7[1];
            *puVar7 = psVar11;
            puVar7[1] = 0;
            *(undefined1 *)psVar11 = 0;
            plVar6 = (long *)std::__cxx11::string::append((char *)&local_138);
            paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(plVar6 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar6 == paVar10) {
              local_f8.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
              local_f8.field_2._8_8_ = plVar6[3];
              local_f8._M_dataplus._M_p = (pointer)paVar12;
            }
            else {
              local_f8.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
              local_f8._M_dataplus._M_p = (pointer)*plVar6;
            }
            local_f8._M_string_length = plVar6[1];
            *plVar6 = (long)paVar10;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            Issue::IssueImpl::setDescription(pIVar2,&local_f8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f8._M_dataplus._M_p != paVar12) {
              operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_138._M_dataplus._M_p != &local_138.field_2) {
              operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
              operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
            }
            if (local_118 != &local_108) {
              operator_delete(local_118,local_108 + 1);
            }
            if (local_d0 != &local_c0) {
              operator_delete(local_d0,local_c0 + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_80._M_dataplus._M_p != &local_80.field_2) {
              operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
            }
            Issue::IssueImpl::setReferenceRule
                      (*(IssueImpl **)
                        ((long)local_90.
                               super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr + 8),UNITS_ELEMENT);
          }
          AnyCellmlElement::AnyCellmlElementImpl::setUnits
                    ((AnyCellmlElementImpl *)
                     **(undefined8 **)
                       (*(size_type *)
                         ((long)local_90.
                                super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr + 8) + 0x28),units);
          Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,&local_90);
          if (local_90.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_90.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
        }
      }
      XmlAttribute::next((XmlAttribute *)&local_f8);
      _Var3._M_pi = local_50.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
      local_50.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._M_string_length;
      local_50.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_f8._M_dataplus._M_p;
      local_f8._M_dataplus._M_p = (pointer)0x0;
      local_f8._M_string_length = 0;
      if (_Var3._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var3._M_pi);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._M_string_length);
      }
    } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_50.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr !=
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0);
    if ((local_40 & 1) != 0) goto LAB_0023d9f5;
  }
  Issue::IssueImpl::create();
  pIVar2 = *(IssueImpl **)(local_138._M_dataplus._M_p + 8);
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_f8,"Units does not specify a name attribute.","");
  Issue::IssueImpl::setDescription(pIVar2,&local_f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  AnyCellmlElement::AnyCellmlElementImpl::setUnits
            ((AnyCellmlElementImpl *)
             **(undefined8 **)(*(long *)(local_138._M_dataplus._M_p + 8) + 0x28),units);
  Issue::IssueImpl::setReferenceRule(*(IssueImpl **)(local_138._M_dataplus._M_p + 8),UNITS_NAME);
  Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)&local_138);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._M_string_length);
  }
LAB_0023d9f5:
  XmlNode::firstChild((XmlNode *)&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    do {
      if (this->mParsing20Version == true) {
        bVar4 = XmlNode::isCellml20Element
                          ((XmlNode *)
                           local_90.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr,"unit");
      }
      else {
        bVar4 = XmlNode::isCellml1XElement
                          ((XmlNode *)
                           local_90.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr,"unit");
      }
      if (bVar4 == false) {
        bVar4 = XmlNode::isText((XmlNode *)
                                local_90.
                                super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr);
        if (bVar4) {
          XmlNode::convertToString_abi_cxx11_
                    (&local_f8,
                     (XmlNode *)
                     local_90.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
          bVar4 = hasNonWhitespaceCharacters(&local_f8);
          if (bVar4) {
            Issue::IssueImpl::create();
            pIVar2 = (local_60.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->mPimpl;
            NamedEntity::name_abi_cxx11_
                      (&local_b0,
                       &((units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>).
                        _M_ptr)->super_NamedEntity);
            plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,0x2a2452);
            local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
            psVar11 = (size_type *)(plVar6 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar6 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar11) {
              local_80.field_2._M_allocated_capacity = *psVar11;
              local_80.field_2._8_8_ = plVar6[3];
            }
            else {
              local_80.field_2._M_allocated_capacity = *psVar11;
              local_80._M_dataplus._M_p = (pointer)*plVar6;
            }
            local_80._M_string_length = plVar6[1];
            *plVar6 = (long)psVar11;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            plVar6 = (long *)std::__cxx11::string::append((char *)&local_80);
            local_d0 = &local_c0;
            plVar8 = plVar6 + 2;
            if ((long *)*plVar6 == plVar8) {
              local_c0 = *plVar8;
              lStack_b8 = plVar6[3];
            }
            else {
              local_c0 = *plVar8;
              local_d0 = (long *)*plVar6;
            }
            local_c8 = plVar6[1];
            *plVar6 = (long)plVar8;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            plVar6 = (long *)std::__cxx11::string::_M_append
                                       ((char *)&local_d0,(ulong)local_f8._M_dataplus._M_p);
            local_118 = &local_108;
            puVar9 = (ulong *)(plVar6 + 2);
            if ((ulong *)*plVar6 == puVar9) {
              local_108 = *puVar9;
              lStack_100 = plVar6[3];
            }
            else {
              local_108 = *puVar9;
              local_118 = (ulong *)*plVar6;
            }
            local_110 = plVar6[1];
            *plVar6 = (long)puVar9;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_118);
            local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
            psVar11 = puVar7 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar7 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar11) {
              local_138.field_2._M_allocated_capacity = *psVar11;
              local_138.field_2._8_8_ = puVar7[3];
            }
            else {
              local_138.field_2._M_allocated_capacity = *psVar11;
              local_138._M_dataplus._M_p = (pointer)*puVar7;
            }
            local_138._M_string_length = puVar7[1];
            *puVar7 = psVar11;
            puVar7[1] = 0;
            *(undefined1 *)(puVar7 + 2) = 0;
            Issue::IssueImpl::setDescription(pIVar2,&local_138);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_138._M_dataplus._M_p != &local_138.field_2) {
              operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_118 != &local_108) {
              operator_delete(local_118,local_108 + 1);
            }
            if (local_d0 != &local_c0) {
              operator_delete(local_d0,local_c0 + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_80._M_dataplus._M_p != &local_80.field_2) {
              operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
              operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
            }
            AnyCellmlElement::AnyCellmlElementImpl::setUnits
                      ((((local_60.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->mPimpl->mItem).
                        super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->mPimpl,units);
            Issue::IssueImpl::setReferenceRule
                      ((local_60.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->mPimpl,XML_UNEXPECTED_CHARACTER);
            Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,&local_60);
            if (local_60.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_60.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
            operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          bVar4 = XmlNode::isComment((XmlNode *)
                                     local_90.
                                     super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr);
          if (!bVar4) {
            Issue::IssueImpl::create();
            pIVar2 = (local_60.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->mPimpl;
            NamedEntity::name_abi_cxx11_
                      (&local_80,
                       &((units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>).
                        _M_ptr)->super_NamedEntity);
            plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_80,0,(char *)0x0,0x2a2452);
            local_d0 = &local_c0;
            plVar8 = plVar6 + 2;
            if ((long *)*plVar6 == plVar8) {
              local_c0 = *plVar8;
              lStack_b8 = plVar6[3];
            }
            else {
              local_c0 = *plVar8;
              local_d0 = (long *)*plVar6;
            }
            local_c8 = plVar6[1];
            *plVar6 = (long)plVar8;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            plVar6 = (long *)std::__cxx11::string::append((char *)&local_d0);
            local_118 = &local_108;
            puVar9 = (ulong *)(plVar6 + 2);
            if ((ulong *)*plVar6 == puVar9) {
              local_108 = *puVar9;
              lStack_100 = plVar6[3];
            }
            else {
              local_108 = *puVar9;
              local_118 = (ulong *)*plVar6;
            }
            local_110 = plVar6[1];
            *plVar6 = (long)puVar9;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            XmlNode::name_abi_cxx11_
                      (&local_b0,
                       (XmlNode *)
                       local_90.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
            uVar13 = 0xf;
            if (local_118 != &local_108) {
              uVar13 = local_108;
            }
            if (uVar13 < local_b0._M_string_length + local_110) {
              uVar5 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
                uVar5 = local_b0.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar5 < local_b0._M_string_length + local_110) goto LAB_0023dcdd;
              puVar7 = (undefined8 *)
                       std::__cxx11::string::replace
                                 ((ulong)&local_b0,0,(char *)0x0,(ulong)local_118);
            }
            else {
LAB_0023dcdd:
              puVar7 = (undefined8 *)
                       std::__cxx11::string::_M_append
                                 ((char *)&local_118,(ulong)local_b0._M_dataplus._M_p);
            }
            local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
            psVar11 = puVar7 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar7 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar11) {
              local_138.field_2._M_allocated_capacity = *psVar11;
              local_138.field_2._8_8_ = puVar7[3];
            }
            else {
              local_138.field_2._M_allocated_capacity = *psVar11;
              local_138._M_dataplus._M_p = (pointer)*puVar7;
            }
            local_138._M_string_length = puVar7[1];
            *puVar7 = psVar11;
            puVar7[1] = 0;
            *(undefined1 *)psVar11 = 0;
            plVar6 = (long *)std::__cxx11::string::append((char *)&local_138);
            local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
            paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(plVar6 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar6 == paVar12) {
              local_f8.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
              local_f8.field_2._8_8_ = plVar6[3];
            }
            else {
              local_f8.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
              local_f8._M_dataplus._M_p = (pointer)*plVar6;
            }
            local_f8._M_string_length = plVar6[1];
            *plVar6 = (long)paVar12;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            Issue::IssueImpl::setDescription(pIVar2,&local_f8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
              operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_138._M_dataplus._M_p != &local_138.field_2) {
              operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
              operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
            }
            if (local_118 != &local_108) {
              operator_delete(local_118,local_108 + 1);
            }
            if (local_d0 != &local_c0) {
              operator_delete(local_d0,local_c0 + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_80._M_dataplus._M_p != &local_80.field_2) {
              operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
            }
            AnyCellmlElement::AnyCellmlElementImpl::setUnits
                      ((((local_60.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->mPimpl->mItem).
                        super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->mPimpl,units);
            Issue::IssueImpl::setReferenceRule
                      ((local_60.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->mPimpl,XML_UNEXPECTED_ELEMENT);
            Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,&local_60);
            if (local_60.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_60.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
          }
        }
      }
      else {
        loadUnit(this,units,(XmlNodePtr *)&local_90);
      }
      XmlNode::next((XmlNode *)&local_f8);
      _Var3._M_pi = local_90.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
      local_90.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._M_string_length;
      local_90.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_f8._M_dataplus._M_p;
      local_f8._M_dataplus._M_p = (pointer)0x0;
      local_f8._M_string_length = 0;
      if (_Var3._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var3._M_pi);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._M_string_length);
      }
    } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_90.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0);
  }
  if (local_90.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_90.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  if (local_50.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_50.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

void Parser::ParserImpl::loadUnits(const UnitsPtr &units, const XmlNodePtr &node)
{
    XmlAttributePtr attribute = node->firstAttribute();
    bool nameAttributePresent = false;
    while (attribute != nullptr) {
        if (attribute->isType("name")) {
            units->setName(attribute->value());
            nameAttributePresent = true;
        } else if (isIdAttribute(attribute, mParsing1XVersion)) {
            units->setId(attribute->value());
        } else {
            auto issue = Issue::IssueImpl::create();
            if (mParsing1XVersion) {
                issue->mPimpl->setDescription("Units '" + units->name() + "' ignoring attribute '" + attribute->name() + "'.");
                issue->mPimpl->setLevel(Issue::Level::MESSAGE);
            } else {
                issue->mPimpl->setDescription("Units '" + units->name() + "' has an invalid attribute '" + attribute->name() + "'.");
                issue->mPimpl->setReferenceRule(Issue::ReferenceRule::UNITS_ELEMENT);
            }
            issue->mPimpl->mItem->mPimpl->setUnits(units);
            addIssue(issue);
        }
        attribute = attribute->next();
    }

    if (!nameAttributePresent) {
        auto issue = Issue::IssueImpl::create();
        issue->mPimpl->setDescription("Units does not specify a name attribute.");
        issue->mPimpl->mItem->mPimpl->setUnits(units);
        issue->mPimpl->setReferenceRule(Issue::ReferenceRule::UNITS_NAME);
        addIssue(issue);
    }

    XmlNodePtr childNode = node->firstChild();
    while (childNode != nullptr) {
        if (parseNode(childNode, "unit")) {
            loadUnit(units, childNode);
        } else if (childNode->isText()) {
            std::string textNode = childNode->convertToString();
            // Ignore whitespace when parsing.
            if (hasNonWhitespaceCharacters(textNode)) {
                auto issue = Issue::IssueImpl::create();
                issue->mPimpl->setDescription("Units '" + units->name() + "' has an invalid non-whitespace child text element '" + textNode + "'.");
                issue->mPimpl->mItem->mPimpl->setUnits(units);
                issue->mPimpl->setReferenceRule(Issue::ReferenceRule::XML_UNEXPECTED_CHARACTER);
                addIssue(issue);
            }
        } else if (childNode->isComment()) {
            // Do nothing.
        } else {
            auto issue = Issue::IssueImpl::create();
            issue->mPimpl->setDescription("Units '" + units->name() + "' has an invalid child element '" + childNode->name() + "'.");
            issue->mPimpl->mItem->mPimpl->setUnits(units);
            issue->mPimpl->setReferenceRule(Issue::ReferenceRule::XML_UNEXPECTED_ELEMENT);
            addIssue(issue);
        }
        childNode = childNode->next();
    }
}